

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::Prime(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachPageAllocator<Memory::HeapInfo::Prime()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::Prime()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->Prime(RecyclerPageAllocator::DefaultPrimePageCount);
    });
}